

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer_test.cc
# Opt level: O1

void __thiscall AomLeb128_DecodeTest_Test::TestBody(AomLeb128_DecodeTest_Test *this)

{
  undefined8 *puVar1;
  SEARCH_METHODS *pSVar2;
  AssertionResult gtest_ar;
  uint8_t leb128_bytes [3];
  size_t length;
  uint64_t value;
  size_t expected_length;
  uint64_t expected_value;
  Message local_58;
  AssertHelper local_50;
  internal local_48 [8];
  undefined8 *local_40;
  uint8_t local_34 [4];
  size_t local_30;
  uint64_t local_28;
  unsigned_long local_20 [2];
  
  local_34[2] = 0x26;
  local_34[0] = 0xe5;
  local_34[1] = 0x8e;
  local_20[1] = 0x98765;
  local_20[0] = 3;
  local_28 = 0xffffffffffffffff;
  local_58.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = aom_uleb_decode(local_34,3,&local_28,&local_30);
  local_50.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            (local_48,"aom_uleb_decode(&leb128_bytes[0], num_leb128_bytes, &value, &length)","0",
             (int *)&local_58,(int *)&local_50);
  puVar1 = local_40;
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message(&local_58);
    if (local_40 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_40;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
               ,0x27,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_58);
  }
  else {
    if (local_40 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_40 != local_40 + 2) {
        operator_delete((undefined8 *)*local_40);
      }
      operator_delete(puVar1);
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_48,"expected_value","value",local_20 + 1,&local_28);
    puVar1 = local_40;
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message(&local_58);
      if (local_40 == (undefined8 *)0x0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = (SEARCH_METHODS *)*local_40;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
                 ,0x28,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_50,&local_58);
    }
    else {
      if (local_40 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_40 != local_40 + 2) {
          operator_delete((undefined8 *)*local_40);
        }
        operator_delete(puVar1);
      }
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (local_48,"expected_length","length",local_20,&local_30);
      puVar1 = local_40;
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message(&local_58);
        if (local_40 == (undefined8 *)0x0) {
          pSVar2 = "";
        }
        else {
          pSVar2 = (SEARCH_METHODS *)*local_40;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
                   ,0x29,(char *)pSVar2);
        testing::internal::AssertHelper::operator=(&local_50,&local_58);
      }
      else {
        if (local_40 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_40 != local_40 + 2) {
            operator_delete((undefined8 *)*local_40);
          }
          operator_delete(puVar1);
        }
        aom_uleb_decode(local_34,4,&local_28,&local_30);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  (local_48,"expected_value","value",local_20 + 1,&local_28);
        puVar1 = local_40;
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message(&local_58);
          if (local_40 == (undefined8 *)0x0) {
            pSVar2 = "";
          }
          else {
            pSVar2 = (SEARCH_METHODS *)*local_40;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
                     ,0x2d,(char *)pSVar2);
          testing::internal::AssertHelper::operator=(&local_50,&local_58);
        }
        else {
          if (local_40 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_40 != local_40 + 2) {
              operator_delete((undefined8 *)*local_40);
            }
            operator_delete(puVar1);
          }
          testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                    (local_48,"expected_length","length",local_20,&local_30);
          if (local_48[0] != (internal)0x0) goto LAB_00459d9a;
          testing::Message::Message(&local_58);
          if (local_40 == (undefined8 *)0x0) {
            pSVar2 = "";
          }
          else {
            pSVar2 = (SEARCH_METHODS *)*local_40;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
                     ,0x2e,(char *)pSVar2);
          testing::internal::AssertHelper::operator=(&local_50,&local_58);
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  if ((long *)CONCAT44(local_58.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       (int)local_58.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_58.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   (int)local_58.ss_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl) + 8))();
  }
LAB_00459d9a:
  if (local_40 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_40 != local_40 + 2) {
      operator_delete((undefined8 *)*local_40);
    }
    operator_delete(local_40);
  }
  return;
}

Assistant:

TEST(AomLeb128, DecodeTest) {
  const size_t num_leb128_bytes = 3;
  const uint8_t leb128_bytes[num_leb128_bytes] = { 0xE5, 0x8E, 0x26 };
  const uint64_t expected_value = 0x98765;  // 624485
  const size_t expected_length = 3;
  uint64_t value = ~0ULL;  // make sure value is cleared by the function
  size_t length;
  ASSERT_EQ(
      aom_uleb_decode(&leb128_bytes[0], num_leb128_bytes, &value, &length), 0);
  ASSERT_EQ(expected_value, value);
  ASSERT_EQ(expected_length, length);

  // Make sure the decoder stops on the last marked LEB128 byte.
  aom_uleb_decode(&leb128_bytes[0], num_leb128_bytes + 1, &value, &length);
  ASSERT_EQ(expected_value, value);
  ASSERT_EQ(expected_length, length);
}